

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FenceVkImpl.cpp
# Opt level: O2

void __thiscall Diligent::FenceVkImpl::Wait(FenceVkImpl *this,Uint64 Value)

{
  VulkanLogicalDevice *this_00;
  _Elt_pointer pSVar1;
  VkResult VVar2;
  Uint64 Value_local;
  string msg;
  string msg_1;
  
  if ((this->m_TimelineSemaphore).m_VkObject == (VkSemaphore_T *)0x0) {
    std::mutex::lock(&this->m_SyncPointsGuard);
    this_00 = (((this->super_FenceBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
               .m_pDevice)->m_LogicalVkDevice).
              super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    while ((pSVar1 = (this->m_SyncPoints).
                     super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur,
           (this->m_SyncPoints).
           super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur != pSVar1 && (pSVar1->Value <= Value)))
    {
      msg._M_dataplus._M_p =
           (pointer)(((pSVar1->SyncPoint).
                      super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->m_Fence).m_VkSyncObject;
      VVar2 = VulkanUtilities::VulkanLogicalDevice::GetFenceStatus
                        (this_00,(VkFence)msg._M_dataplus._M_p);
      if (VVar2 == VK_NOT_READY) {
        VVar2 = VulkanUtilities::VulkanLogicalDevice::WaitForFences
                          (this_00,1,(VkFence *)&msg,1,0xffffffffffffffff);
      }
      if (VVar2 != VK_SUCCESS) {
        FormatString<char[41]>(&msg_1,(char (*) [41])"All pending fences must now be complete!");
        DebugAssertionFailed
                  (msg_1._M_dataplus._M_p,"Wait",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
                   ,0xe4);
        std::__cxx11::string::~string((string *)&msg_1);
      }
      FenceBase<Diligent::EngineVkImplTraits>::UpdateLastCompletedFenceValue
                (&this->super_FenceBase<Diligent::EngineVkImplTraits>,pSVar1->Value);
      std::
      deque<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
      ::pop_front(&this->m_SyncPoints);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_SyncPointsGuard);
  }
  else {
    msg_1.field_2._8_8_ = &(this->m_TimelineSemaphore).m_VkObject;
    msg_1._M_string_length = 0;
    msg_1._M_dataplus._M_p = (pointer)0x3b9df29c;
    msg_1.field_2._M_allocated_capacity = 0x100000000;
    VVar2 = VulkanUtilities::VulkanLogicalDevice::WaitSemaphores
                      ((((this->super_FenceBase<Diligent::EngineVkImplTraits>).
                         super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                        .m_pDevice)->m_LogicalVkDevice).
                       super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,(VkSemaphoreWaitInfo *)&msg_1,0xffffffffffffffff);
    if (VVar2 != VK_SUCCESS) {
      FormatString<char[34]>(&msg,(char (*) [34])"Failed to wait timeline semaphore");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"Wait",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
                 ,0xd0);
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  return;
}

Assistant:

void FenceVkImpl::Wait(Uint64 Value)
{
    if (IsTimelineSemaphore())
    {
        const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = m_pDevice->GetLogicalDevice();

        VkSemaphoreWaitInfo WaitInfo{};
        WaitInfo.sType          = VK_STRUCTURE_TYPE_SEMAPHORE_WAIT_INFO;
        WaitInfo.pNext          = nullptr;
        WaitInfo.flags          = 0;
        WaitInfo.semaphoreCount = 1;
        WaitInfo.pSemaphores    = &m_TimelineSemaphore;
        WaitInfo.pValues        = &Value;

        VkResult err = LogicalDevice.WaitSemaphores(WaitInfo, UINT64_MAX);
        DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to wait timeline semaphore");
    }
    else
    {
        std::lock_guard<std::mutex> Lock{m_SyncPointsGuard};

        const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = m_pDevice->GetLogicalDevice();
        while (!m_SyncPoints.empty())
        {
            SyncPointData& Item = m_SyncPoints.front();
            if (Item.Value > Value)
                break;

            VkFence  Fence  = Item.SyncPoint->GetFence();
            VkResult status = LogicalDevice.GetFenceStatus(Fence);
            if (status == VK_NOT_READY)
            {
                status = LogicalDevice.WaitForFences(1, &Fence, VK_TRUE, UINT64_MAX);
            }

            DEV_CHECK_ERR(status == VK_SUCCESS, "All pending fences must now be complete!");
            UpdateLastCompletedFenceValue(Item.Value);

            m_SyncPoints.pop_front();
        }
    }
}